

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int flikam(double *P,int MP,double *Q,int MQ,double *W,double *E,int N,double *ssq,double *fact,
          double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER)

{
  bool bVar1;
  int MXPQ_00;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double VW1;
  double VL1;
  double R;
  double FLJ;
  double DETMAN;
  double DETCAR;
  double AOR;
  double ALF;
  double A;
  double epsil1;
  double sixteen;
  double four;
  double two;
  double one;
  double p0625;
  double zero;
  int imj;
  int NEXTI;
  int i;
  int JFROM;
  int LOOP;
  int LAST;
  int jp1mk;
  int jp2mk;
  int j;
  int k;
  int FLAG;
  int MPP1;
  int MQP1;
  int MXPQP1;
  int MXPQ;
  int ifault;
  double TOLER_local;
  double *E_local;
  double *W_local;
  int MQ_local;
  double *Q_local;
  int MP_local;
  double *P_local;
  
  *fact = 0.0;
  *ssq = 0.0;
  FLJ = 1.0;
  DETMAN = 0.0;
  MXPQ_00 = imax(MP,MQ);
  iVar2 = MQ + 1;
  NEXTI = MP + 1;
  bVar1 = false;
  MXPQP1 = twacf(P,MP,Q,MQ,VW,MXPQ_00 + 1,VL,MXPQ_00 + 1,VK,MXPQ_00);
  iVar3 = imax(MP,iVar2);
  if (MR != iVar3) {
    MXPQP1 = 6;
  }
  if (MRP1 != MR + 1) {
    MXPQP1 = 7;
  }
  if (MXPQP1 < 1) {
    *VK = *VW;
    if (MR != 1) {
      for (jp2mk = 2; jp2mk <= MR; jp2mk = jp2mk + 1) {
        VK[jp2mk + -1] = 0.0;
        if (jp2mk <= MP) {
          for (jp1mk = jp2mk; jp1mk <= MP; jp1mk = jp1mk + 1) {
            VK[jp2mk + -1] = P[jp1mk + -1] * VW[(jp1mk - jp2mk) + 1] + VK[jp2mk + -1];
          }
        }
        if (jp2mk <= iVar2) {
          for (jp1mk = jp2mk; jp1mk <= iVar2; jp1mk = jp1mk + 1) {
            VK[jp2mk + -1] = -Q[jp1mk + -2] * VL[jp1mk - jp2mk] + VK[jp2mk + -1];
          }
        }
      }
    }
    VL1 = *VK;
    VL[MR + -1] = 0.0;
    for (jp1mk = 0; jp1mk < MR; jp1mk = jp1mk + 1) {
      VW[jp1mk] = 0.0;
      if (jp1mk != MR + -1) {
        VL[jp1mk] = VK[jp1mk + 1];
      }
      if (jp1mk <= MP + -1) {
        VL[jp1mk] = P[jp1mk] * VL1 + VL[jp1mk];
      }
      VK[jp1mk] = VL[jp1mk];
    }
    iVar2 = NEXTI - MQ;
    VW[MP] = 0.0;
    VL[MXPQ_00] = 0.0;
    if (N < 1) {
      P_local._4_4_ = 9;
    }
    else {
      i = MP;
      for (imj = 1; iVar3 = imj, imj <= N; imj = imj + 1) {
        if (imj == iVar2) {
          i = imin(MP,MQ);
          NEXTI = i + 1;
          if (MQ < 1) {
            bVar1 = true;
            break;
          }
        }
        if (VL1 <= 1e-10) {
          return 8;
        }
        if ((ABS(VL1 - 1.0) < TOLER) && (MXPQ_00 < imj)) {
          bVar1 = true;
          break;
        }
        for (FLJ = VL1 * FLJ; 1.0 <= ABS(FLJ); FLJ = FLJ * 0.0625) {
          DETMAN = DETMAN + 4.0;
        }
        for (; ABS(FLJ) < 0.0625; FLJ = FLJ * 16.0) {
          DETMAN = DETMAN - 4.0;
        }
        dVar7 = *VW;
        dVar8 = W[imj + -1] - dVar7;
        dVar4 = sqrt(VL1);
        E[imj + -1] = dVar8 / dVar4;
        dVar4 = dVar8 / VL1;
        *ssq = dVar8 * dVar4 + *ssq;
        dVar8 = *VL;
        dVar5 = dVar8 / VL1;
        VL1 = -dVar5 * dVar8 + VL1;
        if (i != 0) {
          for (jp1mk = 0; jp1mk < i; jp1mk = jp1mk + 1) {
            dVar6 = P[jp1mk] * dVar8 + VL[jp1mk + 1];
            VW[jp1mk] = dVar4 * VK[jp1mk] + P[jp1mk] * dVar7 + VW[jp1mk + 1];
            VL[jp1mk] = -dVar5 * VK[jp1mk] + dVar6;
            VK[jp1mk] = -dVar5 * dVar6 + VK[jp1mk];
          }
        }
        if (NEXTI <= MQ) {
          for (jp1mk = NEXTI; jp1mk <= MQ; jp1mk = jp1mk + 1) {
            VW[jp1mk + -1] = dVar4 * VK[jp1mk + -1] + VW[jp1mk];
            VL[jp1mk + -1] = -dVar5 * VK[jp1mk + -1] + VL[jp1mk];
            VK[jp1mk + -1] = -dVar5 * VL[jp1mk] + VK[jp1mk + -1];
          }
        }
        if (NEXTI <= MP) {
          for (jp1mk = NEXTI; jp1mk <= MP; jp1mk = jp1mk + 1) {
            VW[jp1mk + -1] = P[jp1mk + -1] * W[imj + -1] + VW[jp1mk];
          }
        }
      }
      if (bVar1) {
        MXPQP1 = -imj;
        for (; imj <= N; imj = imj + 1) {
          E[imj + -1] = W[imj + -1];
        }
        imj = iVar3;
        if (MP != 0) {
          for (; imj <= N; imj = imj + 1) {
            for (jp1mk = 1; jp1mk <= MP; jp1mk = jp1mk + 1) {
              E[imj + -1] = -P[jp1mk + -1] * W[(imj - jp1mk) + -1] + E[imj + -1];
            }
          }
        }
        imj = iVar3;
        if (MQ != 0) {
          for (; imj <= N; imj = imj + 1) {
            for (jp1mk = 1; jp1mk <= MQ; jp1mk = jp1mk + 1) {
              E[imj + -1] = Q[jp1mk + -1] * E[(imj - jp1mk) + -1] + E[imj + -1];
            }
          }
        }
        while (imj = iVar3, imj <= N) {
          *ssq = E[imj + -1] * E[imj + -1] + *ssq;
          iVar3 = imj + 1;
        }
      }
      dVar7 = pow(FLJ,1.0 / (double)N);
      dVar8 = pow(2.0,DETMAN / (double)N);
      *fact = dVar7 * dVar8;
      P_local._4_4_ = MXPQP1;
    }
  }
  else {
    P_local._4_4_ = MXPQP1;
  }
  return P_local._4_4_;
}

Assistant:

int flikam(double *P, int MP, double *Q, int MQ,double *W, double *E, int N,double *ssq,double *fact,double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER) {
	int ifault,MXPQ,MXPQP1,MQP1,MPP1,FLAG;
	int k,j,jp2mk,jp1mk,LAST,LOOP,JFROM,i,NEXTI,imj;
	double zero, p0625, one, two, four, sixteen,epsil1;
	double A, ALF, AOR, DETCAR, DETMAN, FLJ, R, VL1, VW1;

	zero = 0.0; p0625 = 0.0625; one = 1.0; two = 2.0; four = 4.0; sixteen = 16.0;
	epsil1 = 1.0e-10;

	*ssq = *fact = zero;
	DETMAN = one;
	DETCAR = zero;
	MXPQ = imax(MP, MQ);// Check
	MXPQP1 = MXPQ + 1;
	MQP1 = MQ + 1;
	MPP1 = MP + 1;
	FLAG = 0;

	ifault = twacf(P, MP,Q, MQ,VW,MXPQP1,VL, MXPQP1,VK,MXPQ);
	if (MR != imax(MP, MQP1)) {
		ifault = 6;
	}
	if (MRP1 != MR + 1) {
		ifault = 7;
	}

	if (ifault > 0) {
		return ifault;
	}

	VK[0] = VW[0];

	if (MR != 1) {
		for (k = 2; k <= MR; ++k) {
			VK[k - 1] = zero;
			if (k <= MP) {
				for (j = k; j <= MP; ++j) {
					jp2mk = j + 2 - k;
					VK[k - 1] += P[j - 1] * VW[jp2mk - 1];
				}
			}//120
			if (k <= MQP1) {
				for (j = k; j <= MQP1; ++j) {
					jp1mk = j + 1 - k;
					VK[k - 1] -= Q[j - 2] * VL[jp1mk - 1];
				}
			}
		}
	}//150

	R = VK[0];
	VL[MR - 1] = zero;
	for (j = 0; j < MR; ++j) {
		VW[j] = zero;
		if (j != MR - 1) {
			VL[j] = VK[j + 1];
		}
		if (j <= MP - 1) {
			VL[j] += P[j] * R;
		}
		VK[j] = VL[j];
	}

	LAST = MPP1 - MQ;
	LOOP = MP;
	JFROM = MPP1;
	VW[MPP1-1] = zero;
	VL[MXPQP1-1] = zero;

	if (N <= 0) {
		return 9;
	}

	for (i = 1; i <= N; ++i) {
		if (i == LAST) {
			LOOP = imin(MP, MQ);
			JFROM = LOOP + 1;
			if (MQ <= 0) {
				FLAG = 1;
				break;
			}
		}
		if (R <= epsil1) {
			return 8;
		}
		if (fabs(R - one) < TOLER && i > MXPQ) {
			FLAG = 1;
			break;
		}
		DETMAN *= R;
		while (fabs(DETMAN) >= one) {
			DETMAN *= p0625;
			DETCAR += four;
		}
		while (fabs(DETMAN) < p0625) {
			DETMAN *= sixteen;
			DETCAR -= four;
		}
		VW1 = VW[0];
		A = W[i - 1] - VW1;
		E[i - 1] = A / sqrt(R);
		AOR = A / R;
		*ssq += A*AOR;
		VL1 = VL[0];
		ALF = VL1 / R;
		R -= ALF * VL1;
		if (LOOP != 0) {
			for (j = 0; j < LOOP; ++j) {
				FLJ = VL[j + 1] + P[j] * VL1;
				VW[j] = VW[j + 1] + P[j] * VW1 + AOR * VK[j];
				VL[j] = FLJ - ALF * VK[j];
				VK[j] -= ALF * FLJ;
			}
		}

		if (JFROM <= MQ) {
			for (j = JFROM; j <= MQ; ++j) {
				VW[j - 1] = VW[j] + AOR * VK[j - 1];
				VL[j - 1] = VL[j] - ALF * VK[j - 1];
				VK[j - 1] -= ALF*VL[j];
			}
		}
		if (JFROM <= MP) {
			for (j = JFROM; j <= MP; ++j) {
				VW[j - 1] = VW[j] + P[j-1] * W[i-1];
			}
		}
	}

	if (FLAG == 1) {
		NEXTI = i;
		ifault = -NEXTI;
		for (i = NEXTI; i <= N; ++i) {
			E[i - 1] = W[i - 1];
		}
		if (MP != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MP; ++j) {
					imj = i - j;
					E[i - 1] -= P[j - 1] * W[imj - 1];
				}
			}
		}//340
		if (MQ != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MQ; ++j) {
					imj = i - j;
					E[i - 1] += Q[j - 1] * E[imj - 1];
				}
			}
		}
		for (i = NEXTI; i <= N; ++i) {
			*ssq += E[i - 1] * E[i - 1];
		}
	}
	/*
	mdisplay(VW, 1, MRP1);
	mdisplay(VL, 1, MRP1);
	mdisplay(VK, 1, MR);
	*/
	*fact = pow(DETMAN, one / (double)N) * pow(two, DETCAR / (double)N);

	return ifault;
}